

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_512f7::DiskInterfaceTestStatMissingFile::Run
          (DiskInterfaceTestStatMissingFile *this)

{
  Test *pTVar1;
  bool bVar2;
  bool condition;
  TimeStamp TVar3;
  allocator<char> local_b1;
  string local_b0;
  uint local_90;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string err;
  DiskInterfaceTestStatMissingFile *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"nosuchfile",&local_51);
  TVar3 = RealDiskInterface::Stat
                    (&(this->super_DiskInterfaceTest).disk_,&local_50,(string *)local_30);
  testing::Test::Check
            (pTVar1,TVar3 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0x35,"0 == disk_.Stat(\"nosuchfile\", &err)");
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0x36,"\"\" == err");
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"nosuchdir/nosuchfile",&local_89);
  TVar3 = RealDiskInterface::Stat
                    (&(this->super_DiskInterfaceTest).disk_,&local_88,(string *)local_30);
  testing::Test::Check
            (pTVar1,TVar3 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0x3a,"0 == disk_.Stat(\"nosuchdir/nosuchfile\", &err)");
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0x3b,"\"\" == err");
  pTVar1 = g_current_test;
  bVar2 = DiskInterfaceTest::Touch(&this->super_DiskInterfaceTest,"notadir");
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                     ,0x3f,"Touch(\"notadir\")");
  pTVar1 = g_current_test;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"notadir/nosuchfile",&local_b1);
    TVar3 = RealDiskInterface::Stat
                      (&(this->super_DiskInterfaceTest).disk_,&local_b0,(string *)local_30);
    testing::Test::Check
              (pTVar1,TVar3 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
               ,0x40,"0 == disk_.Stat(\"notadir/nosuchfile\", &err)");
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pTVar1 = g_current_test;
    condition = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30);
    testing::Test::Check
              (pTVar1,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
               ,0x41,"\"\" == err");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  local_90 = (uint)!bVar2;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatMissingFile) {
  string err;
  EXPECT_EQ(0, disk_.Stat("nosuchfile", &err));
  EXPECT_EQ("", err);

  // On Windows, the errno for a file in a nonexistent directory
  // is different.
  EXPECT_EQ(0, disk_.Stat("nosuchdir/nosuchfile", &err));
  EXPECT_EQ("", err);

  // On POSIX systems, the errno is different if a component of the
  // path prefix is not a directory.
  ASSERT_TRUE(Touch("notadir"));
  EXPECT_EQ(0, disk_.Stat("notadir/nosuchfile", &err));
  EXPECT_EQ("", err);
}